

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::DescriptorScalarReplacement::ReplaceLoadedValue
          (DescriptorScalarReplacement *this,Instruction *var,Instruction *value)

{
  pointer ppIVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  DefUseManager *this_00;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2;
  pointer ppIVar5;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> work_list;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  if (value->opcode_ != OpLoad) {
    __assert_fail("value->opcode() == spv::Op::OpLoad",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                  ,0x195,
                  "bool spvtools::opt::DescriptorScalarReplacement::ReplaceLoadedValue(Instruction *, Instruction *)"
                 );
  }
  uVar3 = Instruction::GetSingleWordInOperand(value,0);
  uVar4 = Instruction::result_id(var);
  if (uVar3 != uVar4) {
    __assert_fail("value->GetSingleWordInOperand(0) == var->result_id()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp"
                  ,0x196,
                  "bool spvtools::opt::DescriptorScalarReplacement::ReplaceLoadedValue(Instruction *, Instruction *)"
                 );
  }
  work_list.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  work_list.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  work_list.
  super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = Pass::get_def_use_mgr(&this->super_Pass);
  uVar3 = Instruction::result_id(value);
  local_38 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp:409:27)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/desc_sroa.cpp:409:27)>
             ::_M_manager;
  local_50._M_unused._M_object = this;
  local_50._8_8_ = &work_list;
  bVar2 = analysis::DefUseManager::WhileEachUser
                    (this_00,uVar3,(function<bool_(spvtools::opt::Instruction_*)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  ppIVar1 = work_list.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppIVar5 = work_list.
            super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (bVar2) {
    do {
      if (ppIVar5 == ppIVar1) {
        IRContext::KillInst((this->super_Pass).context_,value);
        bVar2 = true;
        goto LAB_004ddacb;
      }
      bVar2 = ReplaceCompositeExtract(this,var,*ppIVar5);
      ppIVar5 = ppIVar5 + 1;
    } while (bVar2);
  }
  bVar2 = false;
LAB_004ddacb:
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&work_list.
                 super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
               );
  return bVar2;
}

Assistant:

bool DescriptorScalarReplacement::ReplaceLoadedValue(Instruction* var,
                                                     Instruction* value) {
  // |var| is the global variable that has to be eliminated (OpVariable).
  // |value| is the OpLoad instruction that has loaded |var|.
  // The function expects all users of |value| to be OpCompositeExtract
  // instructions. Otherwise the function returns false with an error message.
  assert(value->opcode() == spv::Op::OpLoad);
  assert(value->GetSingleWordInOperand(0) == var->result_id());
  std::vector<Instruction*> work_list;
  bool failed = !get_def_use_mgr()->WhileEachUser(
      value->result_id(), [this, &work_list](Instruction* use) {
        if (use->opcode() != spv::Op::OpCompositeExtract) {
          context()->EmitErrorMessage(
              "Variable cannot be replaced: invalid instruction", use);
          return false;
        }
        work_list.push_back(use);
        return true;
      });

  if (failed) {
    return false;
  }

  for (Instruction* use : work_list) {
    if (!ReplaceCompositeExtract(var, use)) {
      return false;
    }
  }

  // All usages of the loaded value have been killed. We can kill the OpLoad.
  context()->KillInst(value);
  return true;
}